

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int simpleNext(sqlite3_tokenizer_cursor *pCursor,char **ppToken,int *pnBytes,int *piStartOffset,
              int *piEndOffset,int *piPosition)

{
  uint uVar1;
  char cVar2;
  sqlite3_tokenizer *psVar3;
  sqlite3_tokenizer *psVar4;
  int iVar5;
  sqlite3_tokenizer *psVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  char **ppcVar11;
  char cVar12;
  int iVar13;
  int n;
  uint uVar14;
  
  psVar3 = pCursor->pTokenizer;
  psVar4 = pCursor[1].pTokenizer;
  ppcVar11 = ppToken;
  do {
    iVar5 = *(int *)&pCursor[2].pTokenizer;
    if (iVar5 <= *(int *)((long)&pCursor[2].pTokenizer + 4)) {
      return 0x65;
    }
    iVar9 = *(int *)((long)&pCursor[2].pTokenizer + 4);
    iVar10 = iVar9;
    if (iVar9 < iVar5) {
      pcVar7 = (char *)((long)&psVar4->pModule + (long)iVar9);
      do {
        iVar10 = iVar9;
        if (((long)*pcVar7 < 0) || (*(char *)((long)&psVar3[1].pModule + (long)*pcVar7) == '\0'))
        break;
        iVar9 = iVar9 + 1;
        *(int *)((long)&pCursor[2].pTokenizer + 4) = iVar9;
        pcVar7 = pcVar7 + 1;
        iVar10 = iVar5;
      } while (iVar5 != iVar9);
    }
    iVar9 = *(int *)((long)&pCursor[2].pTokenizer + 4);
    iVar13 = iVar9;
    if (iVar9 < iVar5) {
      pcVar7 = (char *)((long)&psVar4->pModule + (long)iVar9);
      do {
        if ((-1 < (long)*pcVar7) &&
           (iVar13 = iVar9, *(char *)((long)&psVar3[1].pModule + (long)*pcVar7) != '\0')) break;
        iVar9 = iVar9 + 1;
        *(int *)((long)&pCursor[2].pTokenizer + 4) = iVar9;
        pcVar7 = pcVar7 + 1;
        iVar13 = iVar5;
      } while (iVar5 != iVar9);
    }
    uVar14 = iVar13 - iVar10;
    if (uVar14 != 0 && iVar10 <= iVar13) {
      if (*(int *)&pCursor[5].pTokenizer < (int)uVar14) {
        uVar1 = uVar14 + 0x14;
        *(uint *)&pCursor[5].pTokenizer = uVar1;
        psVar6 = pCursor[4].pTokenizer;
        iVar5 = sqlite3_initialize();
        if (iVar5 == 0) {
          if ((int)uVar1 < 1) {
            uVar1 = 0;
          }
          psVar6 = (sqlite3_tokenizer *)sqlite3Realloc(psVar6,(ulong)uVar1);
        }
        else {
          psVar6 = (sqlite3_tokenizer *)0x0;
        }
        if (psVar6 == (sqlite3_tokenizer *)0x0) {
          ppcVar11 = (char **)0x7;
          goto LAB_001cbad7;
        }
        pCursor[4].pTokenizer = psVar6;
      }
      if (0 < (int)uVar14) {
        uVar8 = 0;
        do {
          cVar2 = *(char *)((long)&psVar4->pModule + uVar8 + (long)iVar10);
          cVar12 = cVar2 + ' ';
          if (0x19 < (byte)(cVar2 + 0xbfU)) {
            cVar12 = cVar2;
          }
          *(char *)((long)&(pCursor[4].pTokenizer)->pModule + uVar8) = cVar12;
          uVar8 = uVar8 + 1;
        } while (uVar14 != uVar8);
      }
      *ppToken = (char *)pCursor[4].pTokenizer;
      *pnBytes = uVar14;
      *piStartOffset = iVar10;
      *piEndOffset = *(int *)((long)&pCursor[2].pTokenizer + 4);
      iVar5 = *(int *)&pCursor[3].pTokenizer;
      *(int *)&pCursor[3].pTokenizer = iVar5 + 1;
      *piPosition = iVar5;
      ppcVar11 = (char **)0x0;
    }
LAB_001cbad7:
    if (iVar10 < iVar13) {
      return (int)ppcVar11;
    }
  } while( true );
}

Assistant:

static int simpleNext(
  sqlite3_tokenizer_cursor *pCursor,  /* Cursor returned by simpleOpen */
  const char **ppToken,               /* OUT: *ppToken is the token text */
  int *pnBytes,                       /* OUT: Number of bytes in token */
  int *piStartOffset,                 /* OUT: Starting offset of token */
  int *piEndOffset,                   /* OUT: Ending offset of token */
  int *piPosition                     /* OUT: Position integer of token */
){
  simple_tokenizer_cursor *c = (simple_tokenizer_cursor *) pCursor;
  simple_tokenizer *t = (simple_tokenizer *) pCursor->pTokenizer;
  unsigned char *p = (unsigned char *)c->pInput;

  while( c->iOffset<c->nBytes ){
    int iStartOffset;

    /* Scan past delimiter characters */
    while( c->iOffset<c->nBytes && simpleDelim(t, p[c->iOffset]) ){
      c->iOffset++;
    }

    /* Count non-delimiter characters. */
    iStartOffset = c->iOffset;
    while( c->iOffset<c->nBytes && !simpleDelim(t, p[c->iOffset]) ){
      c->iOffset++;
    }

    if( c->iOffset>iStartOffset ){
      int i, n = c->iOffset-iStartOffset;
      if( n>c->nTokenAllocated ){
        char *pNew;
        c->nTokenAllocated = n+20;
        pNew = sqlite3_realloc(c->pToken, c->nTokenAllocated);
        if( !pNew ) return SQLITE_NOMEM;
        c->pToken = pNew;
      }
      for(i=0; i<n; i++){
        /* TODO(shess) This needs expansion to handle UTF-8
        ** case-insensitivity.
        */
        unsigned char ch = p[iStartOffset+i];
        c->pToken[i] = (char)((ch>='A' && ch<='Z') ? ch-'A'+'a' : ch);
      }
      *ppToken = c->pToken;
      *pnBytes = n;
      *piStartOffset = iStartOffset;
      *piEndOffset = c->iOffset;
      *piPosition = c->iToken++;

      return SQLITE_OK;
    }
  }
  return SQLITE_DONE;
}